

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeDumper.cpp
# Opt level: O0

void Js::AsmJsByteCodeDumper::
     DumpAsmTypedArr<Js::OpLayoutT_AsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
               (OpCodeAsmJs op,OpLayoutT_AsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data
               ,FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  undefined1 local_38 [8];
  WAsmJsMemTag tag;
  ByteCodeReader *reader_local;
  FunctionBody *dumpFunction_local;
  OpLayoutT_AsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data_local;
  OpCodeAsmJs op_local;
  
  tag.heapTag = (char16 *)reader;
  InitializeWAsmJsMemTag(data->ViewType,(WAsmJsMemTag *)local_38);
  switch(op) {
  case LdArr:
    Output::Print(L" %c%d = %s[I%d]",(ulong)(ushort)local_38._0_2_,(ulong)data->Value,tag._0_8_,
                  (ulong)data->SlotIndex);
    break;
  case LdArrConst:
    Output::Print(L" %c%d = %s[%d]",(ulong)(ushort)local_38._0_2_,(ulong)data->Value,tag._0_8_,
                  (ulong)data->SlotIndex);
    break;
  case StArr:
    Output::Print(L" %s[I%d] = %c%d",tag._0_8_,(ulong)data->SlotIndex,(ulong)(ushort)local_38._0_2_,
                  (ulong)data->Value);
    break;
  case StArrConst:
    Output::Print(L" %s[%d] = %c%d",tag._0_8_,(ulong)data->SlotIndex,(ulong)(ushort)local_38._0_2_,
                  (ulong)data->Value);
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                ,0x23b,"((0))","(0)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void AsmJsByteCodeDumper::DumpAsmTypedArr(OpCodeAsmJs op, const unaligned T * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        WAsmJsMemTag tag;
        InitializeWAsmJsMemTag(data->ViewType, &tag);
        switch (op)
        {
        case OpCodeAsmJs::LdArr:
            Output::Print(_u(" %c%d = %s[I%d]"), tag.valueTag, data->Value, tag.heapTag, data->SlotIndex); break;
        case OpCodeAsmJs::LdArrConst:
            Output::Print(_u(" %c%d = %s[%d]"), tag.valueTag, data->Value, tag.heapTag, data->SlotIndex); break;
        case OpCodeAsmJs::StArr:
            Output::Print(_u(" %s[I%d] = %c%d"), tag.heapTag, data->SlotIndex, tag.valueTag, data->Value); break;
        case OpCodeAsmJs::StArrConst:
            Output::Print(_u(" %s[%d] = %c%d"), tag.heapTag, data->SlotIndex, tag.valueTag, data->Value); break;
        default:
            Assume(UNREACHED);
        }
    }